

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

MapFieldBase * __thiscall
google::protobuf::Reflection::GetRawSplit<google::protobuf::internal::MapFieldBase>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  MapFieldBase *pMVar4;
  LogMessage aLStack_38 [16];
  
  this_00 = &this->schema_;
  bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar2) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)aLStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/message.h"
               ,0x642,0x1b,"!schema_.InRealOneof(field)");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_38,8,"Field = ");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (aLStack_38,(string *)(field->all_names_ + 1));
  }
  else {
    if ((this->schema_).split_offset_ != -1) {
      uVar3 = internal::ReflectionSchema::SplitOffset(this_00);
      lVar1 = *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
      uVar3 = internal::ReflectionSchema::GetFieldOffsetNonOneof(this_00,field);
      bVar2 = internal::SplitFieldHasExtraIndirection(field);
      pMVar4 = (MapFieldBase *)((ulong)uVar3 + lVar1);
      if (bVar2) {
        pMVar4 = (MapFieldBase *)(pMVar4->super_MapFieldBaseForParse).vtable_;
      }
      return pMVar4;
    }
    GetRawSplit<google::protobuf::internal::MapFieldBase>();
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aLStack_38)
  ;
}

Assistant:

const Type& Reflection::GetRawSplit(const Message& message,
                                    const FieldDescriptor* field) const {
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const void* split = GetSplitField(&message);
  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  if (internal::SplitFieldHasExtraIndirectionStatic<Type>(field)) {
    return **internal::GetConstPointerAtOffset<Type*>(split, field_offset);
  }
  return *internal::GetConstPointerAtOffset<Type>(split, field_offset);
}